

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
kratos::VarPackedStruct::member_names_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,VarPackedStruct *this)

{
  bool bVar1;
  element_type *peVar2;
  reference __args;
  PackedStructFieldDef *def;
  iterator __end1;
  iterator __begin1;
  vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_> *__range1;
  VarPackedStruct *this_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(__return_storage_ptr__);
  peVar2 = std::__shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->struct_);
  __end1 = std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ::begin(&peVar2->attributes);
  def = (PackedStructFieldDef *)
        std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
        end(&peVar2->attributes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
                                     *)&def), bVar1) {
    __args = __gnu_cxx::
             __normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
             ::operator*(&__end1);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    emplace<std::__cxx11::string_const&>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&__args->name);
    __gnu_cxx::
    __normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> VarPackedStruct::member_names() const {
    std::set<std::string> result;
    for (auto const &def : struct_->attributes) {
        result.emplace(def.name);
    }
    return result;
}